

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBlock.h
# Opt level: O2

void __thiscall Js::ByteBlock::ByteBlock(ByteBlock *this,uint size,ArenaAllocator *alloc)

{
  uchar *ptr;
  
  this->m_contentSize = size;
  (this->m_content).ptr = (uchar *)0x0;
  ptr = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_char,false>
                  ((Memory *)alloc,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,(ulong)size);
  Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierSet(&this->m_content,ptr);
  return;
}

Assistant:

ByteBlock(uint size, ArenaAllocator* alloc) : m_contentSize(size), m_content(nullptr)
        {
            m_content = AnewArray(alloc, byte, size);
        }